

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger_impl.h
# Opt level: O2

void __thiscall
lwlog::
logger<lwlog::configuration<lwlog::disable_local_time,_lwlog::disable_thread_id,_lwlog::disable_process_id,_lwlog::disable_topics>,_lwlog::asynchronous_policy<lwlog::block_overflow_policy,_1024UL,_18446744073709551615UL>,_lwlog::immediate_flush_policy,_lwlog::single_threaded_policy,_lwlog::sinks::stdout_sink>
::set_pattern(logger<lwlog::configuration<lwlog::disable_local_time,_lwlog::disable_thread_id,_lwlog::disable_process_id,_lwlog::disable_topics>,_lwlog::asynchronous_policy<lwlog::block_overflow_policy,_1024UL,_18446744073709551615UL>,_lwlog::immediate_flush_policy,_lwlog::single_threaded_policy,_lwlog::sinks::stdout_sink>
              *this,string_view pattern)

{
  pointer psVar1;
  element_type *peVar2;
  shared_ptr<lwlog::interface::sink> *sink;
  pointer psVar3;
  
  psVar1 = (this->m_backend).sink_storage.
           super__Vector_base<std::shared_ptr<lwlog::interface::sink>,_std::allocator<std::shared_ptr<lwlog::interface::sink>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar3 = (this->m_backend).sink_storage.
                super__Vector_base<std::shared_ptr<lwlog::interface::sink>,_std::allocator<std::shared_ptr<lwlog::interface::sink>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar3 != psVar1; psVar3 = psVar3 + 1) {
    peVar2 = (psVar3->super___shared_ptr<lwlog::interface::sink,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
    ;
    (*peVar2->_vptr_sink[5])(peVar2,pattern._M_len,pattern._M_str);
  }
  return;
}

Assistant:

void logger<Config, LogExecutionPolicy, FlushPolicy, ThreadingPolicy, Sinks...>::set_pattern(
		std::string_view pattern)
	{
		for (const auto& sink : m_backend.sink_storage)
		{ 
			sink->set_pattern(pattern);
		}
	}